

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

int * immutable::rrb_nth<int,false,6>(ref<immutable::rrb<int,_false,_6>_> *rrb,uint32_t index)

{
  uint32_t uVar1;
  rrb<int,_false,_6> *prVar2;
  leaf_node<int,_false> *plVar3;
  uint32_t local_2c;
  uint32_t subidx;
  uint32_t shift;
  internal_node<int,_false> *current;
  uint32_t tail_offset;
  uint32_t index_local;
  ref<immutable::rrb<int,_false,_6>_> *rrb_local;
  
  current._4_4_ = index;
  _tail_offset = rrb;
  prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(rrb);
  if (index < prVar2->cnt) {
    prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(_tail_offset);
    uVar1 = prVar2->cnt;
    prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(_tail_offset);
    current._0_4_ = uVar1 - prVar2->tail_len;
    if (current._4_4_ < (uint)current) {
      prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(_tail_offset);
      _subidx = (internal_node<int,_false> *)(prVar2->root).ptr;
      prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(_tail_offset);
      for (local_2c = prVar2->shift; local_2c != 0; local_2c = local_2c - 6) {
        if ((_subidx->size_table).ptr == (rrb_size_table<false> *)0x0) {
          _subidx = _subidx->child[current._4_4_ >> ((byte)local_2c & 0x1f) & 0x3f].ptr;
        }
        else {
          _subidx = rrb_details::sized<int,false>(_subidx,(uint32_t *)((long)&current + 4),local_2c)
          ;
        }
      }
      rrb_local = (ref<immutable::rrb<int,_false,_6>_> *)
                  ((long)&((_subidx->size_table).ptr)->size + (ulong)(current._4_4_ & 0x3f) * 4);
    }
    else {
      prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(_tail_offset);
      plVar3 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->(&prVar2->tail);
      rrb_local = (ref<immutable::rrb<int,_false,_6>_> *)
                  (plVar3->child + (current._4_4_ - (uint)current));
    }
    return (int *)rrb_local;
  }
  __assert_fail("index < rrb->cnt",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x7c3,
                "const T &immutable::rrb_nth(const ref<rrb<T, atomic_ref_counting, N>> &, uint32_t) [T = int, atomic_ref_counting = false, N = 6]"
               );
}

Assistant:

inline const T& rrb_nth(const ref<rrb<T, atomic_ref_counting, N>>& rrb, uint32_t index)
    {
    using namespace rrb_details;
    assert(index < rrb->cnt);
    const uint32_t tail_offset = rrb->cnt - rrb->tail_len;
    if (tail_offset <= index)
      {
      return rrb->tail->child[index - tail_offset];
      }
    else
      {
      const internal_node<T, atomic_ref_counting>* current = (const internal_node<T, atomic_ref_counting>*)rrb->root.ptr;
      for (uint32_t shift = rrb->shift; shift > 0; shift -= bits<N>::rrb_bits)
        {
        if (current->size_table.ptr == nullptr)
          {
          const uint32_t subidx = (index >> shift) & bits<N>::rrb_mask;
          current = current->child[subidx].ptr;
          }
        else
          {
          current = sized(current, &index, shift);
          }
        }
      return ((const leaf_node<T, atomic_ref_counting>*)current)->child[index & bits<N>::rrb_mask];
      }
    }